

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O0

void __thiscall
xLearn::Model::Initialize
          (Model *this,string *score_func,string *loss_func,index_t num_feature,index_t num_field,
          index_t num_K,index_t aux_size,real_t scale)

{
  byte bVar1;
  bool bVar2;
  index_t iVar3;
  ulong uVar4;
  ostream *poVar5;
  uint in_ECX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  float in_XMM0_Da;
  undefined4 in_stack_00000008;
  char *in_stack_fffffffffffffa08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa10;
  Logger *in_stack_fffffffffffffa20;
  allocator *paVar6;
  string *in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffa90;
  int line;
  string *in_stack_fffffffffffffa98;
  string *file;
  undefined8 in_stack_fffffffffffffaa0;
  LogSeverity LVar7;
  undefined1 in_stack_fffffffffffffb7f;
  Model *in_stack_fffffffffffffb80;
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [32];
  Logger local_270;
  undefined1 local_269 [40];
  allocator local_241;
  string local_240 [32];
  Logger local_220 [61];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  Logger local_e0;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  Logger local_90;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [36];
  Logger local_2c;
  float local_28;
  undefined4 local_24;
  int local_20;
  uint local_1c;
  string *local_18;
  string *local_10;
  
  LVar7 = (LogSeverity)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffa90 >> 0x20);
  local_28 = in_XMM0_Da;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    Logger::Logger(&local_2c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
               ,&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Initialize",&local_89);
    poVar5 = Logger::Start(LVar7,in_stack_fffffffffffffa98,line,in_stack_fffffffffffffa88);
    poVar5 = std::operator<<(poVar5,"CHECK failed ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2e);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"!score_func.empty()");
    poVar5 = std::operator<<(poVar5," = ");
    bVar1 = std::__cxx11::string::empty();
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)(bVar1 ^ 1));
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    Logger::~Logger(in_stack_fffffffffffffa20);
    abort();
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    Logger::Logger(&local_90,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
               ,&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Initialize",&local_d9);
    poVar5 = Logger::Start(LVar7,in_stack_fffffffffffffa98,line,in_stack_fffffffffffffa88);
    poVar5 = std::operator<<(poVar5,"CHECK failed ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2f);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"!loss_func.empty()");
    poVar5 = std::operator<<(poVar5," = ");
    bVar1 = std::__cxx11::string::empty();
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)(bVar1 ^ 1));
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    Logger::~Logger(in_stack_fffffffffffffa20);
    abort();
  }
  if (local_1c == 0) {
    Logger::Logger(&local_e0,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
               ,&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"Initialize",&local_129);
    poVar5 = Logger::Start(LVar7,in_stack_fffffffffffffa98,line,in_stack_fffffffffffffa88);
    poVar5 = std::operator<<(poVar5,"CHECK_GT failed ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x30);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"num_feature");
    poVar5 = std::operator<<(poVar5," = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"0");
    poVar5 = std::operator<<(poVar5," = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    Logger::~Logger(in_stack_fffffffffffffa20);
    abort();
  }
  if (local_28 <= 0.0) {
    Logger::Logger(local_220,ERR);
    paVar6 = &local_241;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_240,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
               ,paVar6);
    LVar7 = (LogSeverity)((ulong)paVar6 >> 0x20);
    file = (string *)local_269;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_269 + 1),"Initialize",(allocator *)file);
    poVar5 = Logger::Start(LVar7,file,line,in_stack_fffffffffffffa88);
    poVar5 = std::operator<<(poVar5,"CHECK_GT failed ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x36);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"scale");
    poVar5 = std::operator<<(poVar5," = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_28);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"0");
    poVar5 = std::operator<<(poVar5," = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)(local_269 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_269);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    Logger::~Logger(in_stack_fffffffffffffa20);
    abort();
  }
  std::__cxx11::string::operator=(in_RDI,local_10);
  std::__cxx11::string::operator=(in_RDI + 0x20,local_18);
  *(uint *)(in_RDI + 0x48) = local_1c;
  *(int *)(in_RDI + 0x4c) = local_20;
  *(undefined4 *)(in_RDI + 0x50) = local_24;
  *(undefined4 *)(in_RDI + 0x54) = in_stack_00000008;
  *(float *)(in_RDI + 0x88) = local_28;
  *(uint *)(in_RDI + 0x40) = local_1c * *(int *)(in_RDI + 0x54);
  bVar2 = std::operator==(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  if (bVar2) {
    *(undefined4 *)(in_RDI + 0x44) = 0;
  }
  else {
    bVar2 = std::operator==(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
    if (bVar2) {
      iVar3 = get_aligned_k((Model *)0x1b93aa);
      *(uint *)(in_RDI + 0x44) = local_1c * iVar3 * *(int *)(in_RDI + 0x54);
    }
    else {
      bVar2 = std::operator==(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
      if (bVar2) {
        iVar3 = get_aligned_k((Model *)0x1b93f9);
        *(uint *)(in_RDI + 0x44) = local_1c * iVar3 * local_20 * *(int *)(in_RDI + 0x54);
      }
      else {
        Logger::Logger(&local_270,FATAL);
        paVar6 = &local_291;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_290,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
                   ,paVar6);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2b8,"Initialize",&local_2b9);
        poVar5 = Logger::Start(LVar7,in_stack_fffffffffffffa98,line,in_stack_fffffffffffffa88);
        poVar5 = std::operator<<(poVar5,"Unknow score function: ");
        std::operator<<(poVar5,local_10);
        std::__cxx11::string::~string(local_2b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
        std::__cxx11::string::~string(local_290);
        std::allocator<char>::~allocator((allocator<char> *)&local_291);
        Logger::~Logger((Logger *)paVar6);
      }
    }
  }
  initial(in_stack_fffffffffffffb80,(bool)in_stack_fffffffffffffb7f);
  return;
}

Assistant:

void Model::Initialize(const std::string& score_func,
                  const std::string& loss_func,
                  index_t num_feature,
                  index_t num_field,
                  index_t num_K,
                  index_t aux_size,
                  real_t scale) {
  CHECK(!score_func.empty());
  CHECK(!loss_func.empty());
  CHECK_GT(num_feature, 0);
  CHECK_GE(num_field, 0);
  CHECK_GE(num_K, 0);
  // The aux_size is used for different 
  // optimization method
  CHECK_GE(aux_size, 0);
  CHECK_GT(scale, 0);
  score_func_ = score_func;
  loss_func_ = loss_func;
  num_feat_ = num_feature;
  num_field_ = num_field;
  num_K_ = num_K;
  aux_size_ = aux_size;
  scale_ = scale;
  // Calculate the number of model parameters
  param_num_w_ = num_feature * aux_size_;
  // latent vector
  if (score_func == "linear") {
    param_num_v_ = 0;
  } else if (score_func == "fm") {
    // fm: feature * K
    param_num_v_ = num_feature * get_aligned_k() * aux_size_;
  } else if (score_func == "ffm") {
    // ffm: feature * K * field
    param_num_v_ = num_feature * get_aligned_k() * num_field * aux_size_;
  } else {
    LOG(FATAL) << "Unknow score function: " << score_func;
  }
  this->initial(true);
}